

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fountain.c
# Opt level: O3

void dowaterdemon(void)

{
  xchar xVar1;
  uint uVar2;
  int iVar3;
  monst *mtmp;
  char *pcVar4;
  trap *ptVar5;
  
  if ((mvitals[300].mvflags & 3) != 0) {
    pline("The fountain bubbles furiously for a moment, then calms.");
    return;
  }
  mtmp = makemon(mons + 300,level,(int)u.ux,(int)u.uy,0);
  if (mtmp == (monst *)0x0) {
    return;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a1431;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a142c;
LAB_001a1465:
    pcVar4 = a_monnam(mtmp);
    pline("You unleash %s!",pcVar4);
  }
  else {
LAB_001a142c:
    if (ublindf != (obj *)0x0) {
LAB_001a1431:
      if (ublindf->oartifact == '\x1d') goto LAB_001a1465;
    }
    pline("You feel the presence of evil.");
  }
  uVar2 = mt_random();
  xVar1 = level_difficulty(&u.uz);
  if (xVar1 + 0x50 <= (int)(uVar2 % 100)) {
    iVar3 = pronoun_gender(level,mtmp);
    pcVar4 = genders[iVar3].his;
    iVar3 = pronoun_gender(level,mtmp);
    pline("Grateful for %s release, %s grants you a wish!",pcVar4,genders[iVar3].he);
    makewish('\0');
    mongone(mtmp);
    return;
  }
  ptVar5 = t_at(level,(int)mtmp->mx,(int)mtmp->my);
  if (ptVar5 == (trap *)0x0) {
    return;
  }
  mintrap(mtmp);
  return;
}

Assistant:

static void dowaterdemon(void) /* Water demon */
{
    struct monst *mtmp;

    if (!(mvitals[PM_WATER_DEMON].mvflags & G_GONE)) {
	if ((mtmp = makemon(&mons[PM_WATER_DEMON], level, u.ux, u.uy, NO_MM_FLAGS))) {
	    if (!Blind)
		pline("You unleash %s!", a_monnam(mtmp));
	    else
		pline("You feel the presence of evil.");

	/* Give those on low levels a (slightly) better chance of survival */
	    if (rnd(100) > (80 + level_difficulty(&u.uz))) {
		pline("Grateful for %s release, %s grants you a wish!",
		      mhis(level, mtmp), mhe(level, mtmp));
		makewish(FALSE);
		mongone(mtmp);
	    } else if (t_at(level, mtmp->mx, mtmp->my))
		mintrap(mtmp);
	}
    } else
	pline("The fountain bubbles furiously for a moment, then calms.");
}